

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<17>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  int *piVar1;
  CodedOutputStream *in_RSI;
  void *in_RDI;
  
  piVar1 = Get<int>(in_RDI);
  WireFormatLite::ZigZagEncode32(*piVar1);
  io::CodedOutputStream::WriteVarint32(in_RSI,(uint32)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteSInt32NoTag(Get<int32>(ptr), output);
  }